

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

void order_unassigned(sat_solver3 *s,int v)

{
  int *piVar1;
  int iVar2;
  int *orderpos;
  int v_local;
  sat_solver3 *s_local;
  
  piVar1 = s->orderpos;
  if (piVar1[v] == -1) {
    iVar2 = veci_size(&s->order);
    piVar1[v] = iVar2;
    veci_push(&s->order,v);
    order_update(s,v);
  }
  return;
}

Assistant:

static inline void order_unassigned(sat_solver3* s, int v) // undoorder
{
    int* orderpos = s->orderpos;
    if (orderpos[v] == -1){
        orderpos[v] = veci_size(&s->order);
        veci_push(&s->order,v);
        order_update(s,v);
//printf( "+%d ", v );
    }
}